

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O1

void Abc_NtkSimulteBuggyMiter(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  void *pvVar2;
  int *pModel;
  long lVar3;
  int *__ptr;
  int *pModel_00;
  uint *__ptr_00;
  long lVar4;
  long lVar5;
  
  if (pNtk->vPis->nSize != 0x23) {
    __assert_fail("strlen(vPiValues1) == (unsigned)Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                  ,0x3fe,"void Abc_NtkSimulteBuggyMiter(Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize == 1) {
    pModel = (int *)malloc((long)pNtk->vCis->nSize << 2);
    lVar3 = 0;
    do {
      pModel[lVar3] = "01001011100000000011010110101000000"[lVar3] + -0x30;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x23);
    lVar3 = (long)pNtk->vBoxes->nSize;
    if (0 < lVar3) {
      ppvVar1 = pNtk->vBoxes->pArray;
      lVar4 = 0;
      do {
        pvVar2 = ppvVar1[lVar4];
        if ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 8) {
          pModel[lVar4 + 0x23] = *(int *)((long)pvVar2 + 0x38) + -1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
    printf("Value = %d\n");
    pModel_00 = (int *)malloc((long)pNtk->vCis->nSize << 2);
    lVar3 = (long)pNtk->vPis->nSize;
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        pModel_00[lVar4] = "11001101011101011111110100100010001"[lVar4] + -0x30;
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    lVar4 = (long)pNtk->vBoxes->nSize;
    if (0 < lVar4) {
      ppvVar1 = pNtk->vBoxes->pArray;
      lVar5 = 0;
      do {
        if ((*(uint *)((long)ppvVar1[lVar5] + 0x14) & 0xf) == 8) {
          pModel_00[lVar3 + lVar5] = __ptr[pNtk->vPos->nSize + lVar5];
        }
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    __ptr_00 = (uint *)Abc_NtkVerifySimulatePattern(pNtk,pModel_00);
    printf("Value = %d\n",(ulong)*__ptr_00);
    if (pModel != (int *)0x0) {
      free(pModel);
    }
    if (pModel_00 != (int *)0x0) {
      free(pModel_00);
    }
    free(__ptr);
    free(__ptr_00);
    return;
  }
  __assert_fail("1 == Abc_NtkPoNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                ,0x3ff,"void Abc_NtkSimulteBuggyMiter(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkSimulteBuggyMiter( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    int * pModel1, * pModel2, * pResult1, * pResult2;
    char * vPiValues1 = "01001011100000000011010110101000000";
    char * vPiValues2 = "11001101011101011111110100100010001";

    assert( strlen(vPiValues1) == (unsigned)Abc_NtkPiNum(pNtk) );
    assert( 1 == Abc_NtkPoNum(pNtk) );

    pModel1 = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pModel1[i] = vPiValues1[i] - '0';
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pModel1[Abc_NtkPiNum(pNtk)+i] = ((int)(ABC_PTRINT_T)pObj->pData) - 1;

    pResult1 = Abc_NtkVerifySimulatePattern( pNtk, pModel1 );
    printf( "Value = %d\n", pResult1[0] );

    pModel2 = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pModel2[i] = vPiValues2[i] - '0';
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pModel2[Abc_NtkPiNum(pNtk)+i] = pResult1[Abc_NtkPoNum(pNtk)+i];

    pResult2 = Abc_NtkVerifySimulatePattern( pNtk, pModel2 );
    printf( "Value = %d\n", pResult2[0] );

    ABC_FREE( pModel1 );
    ABC_FREE( pModel2 );
    ABC_FREE( pResult1 );
    ABC_FREE( pResult2 );
}